

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.h
# Opt level: O0

void __thiscall
dynamicgraph::
SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
::SignalTimeDependent
          (SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this,SignalArray_const<int> *arr,string *name)

{
  string local_40;
  string *local_20;
  string *name_local;
  SignalArray_const<int> *arr_local;
  SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *this_local;
  
  local_20 = name;
  name_local = (string *)arr;
  arr_local = (SignalArray_const<int> *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  Signal((Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *)&this->field_0x40,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_TimeDependency<int>)._vptr_TimeDependency =
       (_func_int **)&PTR__SignalTimeDependent_0015b780;
  *(undefined ***)&this->field_0x40 = &PTR__SignalTimeDependent_0015b8f0;
  TimeDependency<int>::TimeDependency
            (&this->super_TimeDependency<int>,
             (SignalBase<int> *)
             ((long)&(this->super_TimeDependency<int>)._vptr_TimeDependency +
             (long)(this->super_TimeDependency<int>)._vptr_TimeDependency[-3]),
             (SignalArray_const<int> *)name_local,TIME_DEPENDENT);
  (this->super_TimeDependency<int>)._vptr_TimeDependency =
       (_func_int **)&PTR__SignalTimeDependent_0015b780;
  *(undefined ***)&this->field_0x40 = &PTR__SignalTimeDependent_0015b8f0;
  return;
}

Assistant:

SignalTimeDependent<T, Time>::SignalTimeDependent(
    const SignalArray_const<Time> &arr, std::string name)
    : Signal<T, Time>(name), TimeDependency<Time>(this, arr) {}